

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

string * __thiscall
libcellml::Generator::GeneratorImpl::generateOneParameterFunctionCode
          (string *__return_storage_ptr__,GeneratorImpl *this,string *function,
          AnalyserEquationAstPtr *ast)

{
  AnalyserEquationAstPtr AStack_88;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_58,function,"(");
  AnalyserEquationAst::leftChild((AnalyserEquationAst *)&AStack_88);
  generateCode_abi_cxx11_(&local_78,this,&AStack_88);
  std::operator+(&local_38,&local_58,&local_78);
  std::operator+(__return_storage_ptr__,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&AStack_88.
              super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::GeneratorImpl::generateOneParameterFunctionCode(const std::string &function,
                                                                       const AnalyserEquationAstPtr &ast) const
{
    return function + "(" + generateCode(ast->leftChild()) + ")";
}